

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int magma_cipher_do_ecb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (iVar1 == 0) {
    if (inl != 0) {
      do {
        magmadecrypt((gost_ctx *)(lVar2 + 0x1c),in,out);
        out = out + 8;
        in = in + 8;
        inl = inl - 8;
      } while (inl != 0);
    }
  }
  else if (inl != 0) {
    do {
      magmacrypt((gost_ctx *)(lVar2 + 0x1c),in,out);
      out = out + 8;
      in = in + 8;
      inl = inl - 8;
    } while (inl != 0);
  }
  return 1;
}

Assistant:

static int magma_cipher_do_ecb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                        const unsigned char *in, size_t inl)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        while (inl > 0) {
            magmacrypt(&(c->cctx), in, out);
            out += 8;
            in += 8;
            inl -= 8;
        }
    } else {
        while (inl > 0) {
            magmadecrypt(&(c->cctx), in, out);
            out += 8;
            in += 8;
            inl -= 8;
        }
    }
    return 1;
}